

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O3

void do_cmd_time(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char cVar5;
  char *pcVar6;
  char cVar7;
  
  uVar1 = (uint)z_info->day_length * 10;
  iVar4 = turn % (int)uVar1 + (uVar1 >> 2);
  iVar2 = (iVar4 * 0x18) / (int)uVar1;
  iVar2 = iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 2) - (iVar2 >> 0x1f)) * -0x18;
  cVar5 = (char)iVar2;
  uVar3 = cVar5 * 0x2b & 0xffff;
  cVar5 = cVar5 + ((char)(uVar3 >> 9) + (char)(uVar3 >> 0xf)) * -0xc;
  cVar7 = '\f';
  if (cVar5 != '\0') {
    cVar7 = cVar5;
  }
  pcVar6 = "PM";
  if (iVar2 < 0xc) {
    pcVar6 = "AM";
  }
  msg("This is day %d. The time is %d:%02d %s.",(ulong)(turn / (int)uVar1 + 1),
      (ulong)(uint)(int)cVar7,(ulong)(uint)(((iVar4 * 0x5a0) / (int)uVar1) % 0x3c),pcVar6);
  return;
}

Assistant:

void do_cmd_time(void)
{
	int32_t len = 10L * z_info->day_length;
	int32_t tick = turn % len + len / 4;

	int day = turn / len + 1;
	int hour = (24 * tick / len) % 24;
	int min = (1440 * tick / len) % 60;


	/* Message */
	msg("This is day %d. The time is %d:%02d %s.", day,
		(hour % 12 == 0) ? 12 : (hour % 12), min,
		(hour < 12) ? "AM" : "PM");
}